

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertion-sort.c
# Opt level: O1

void insertion_sort(int *array,size_t length)

{
  int iVar1;
  long lVar2;
  void *__dest;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  __dest = malloc(length * 4);
  if (length != 0) {
    memcpy(__dest,array,length * 4);
  }
  if (1 < length) {
    uVar3 = 1;
    sVar4 = 1;
    do {
      iVar1 = *(int *)((long)__dest + sVar4 * 4);
      bVar7 = uVar3 != 0;
      if (bVar7) {
        if (*array < iVar1) {
          uVar6 = 0;
          do {
            if (uVar3 - 1 == uVar6) {
              bVar7 = false;
              goto LAB_00101277;
            }
            uVar5 = uVar6 + 1;
            lVar2 = uVar6 + 1;
            uVar6 = uVar5;
          } while (array[lVar2] < iVar1);
          bVar7 = uVar5 < uVar3;
        }
        else {
          uVar5 = 0;
        }
        uVar3 = uVar3 + 1;
        for (uVar6 = uVar3; uVar5 < uVar6; uVar6 = uVar6 - 1) {
          array[uVar6] = array[uVar6 - 1];
        }
        array[uVar5] = iVar1;
      }
LAB_00101277:
      if (!bVar7) {
        array[uVar3] = iVar1;
        uVar3 = uVar3 + 1;
      }
      sVar4 = sVar4 + 1;
    } while (sVar4 != length);
  }
  free(__dest);
  return;
}

Assistant:

void insertion_sort(int* array, const size_t length) {
  int* buffer = (int*)malloc(length * sizeof(int));
  size_t target_len = 1; // populated by the first element, already present
  for (size_t n = 0; n < length; n++) {
    buffer[n] = array[n];
  }
  for (size_t buffer_pos = 1; buffer_pos < length; buffer_pos++) {
    int current = buffer[buffer_pos];
    bool inserted = false;
    for (size_t n = 0; n < target_len; n++) {
      if (array[n] >= current) {
        // shift and insert
        for (size_t o = target_len + 1; o > n; o--) {
          array[o] = array[o - 1];
        }
        array[n] = current;
        target_len++;
        inserted = true;
        break;
      }
    }
    if (!inserted) {
      // push at the end
      array[target_len] = current;
      target_len++;
    }
  }
  free(buffer);
}